

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManNodeIfToGia(Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vLeaves,
                      int fHash)

{
  Vec_Ptr_t *vVisited;
  uint uVar1;
  float fVar2;
  int iVar3;
  If_Obj_t *pIVar4;
  undefined4 *puVar5;
  ulong uVar6;
  int i;
  
  uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  if (uVar1 < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x56c,
                  "int Gia_ManNodeIfToGia(Gia_Man_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *, int)");
  }
  for (uVar6 = 0; uVar6 < uVar1 >> 0x18; uVar6 = uVar6 + 1) {
    pIVar4 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar6 * 4));
    if (pIVar4 == (If_Obj_t *)0x0) break;
    fVar2 = (float)Vec_IntEntry(vLeaves,(int)uVar6);
    (pIVar4->CutBest).Area = fVar2;
    uVar1 = *(uint *)&(pIfObj->CutBest).field_0x1c;
  }
  vVisited = pIfMan->vTemp;
  vVisited->nSize = 0;
  iVar3 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIfObj,vVisited,fHash);
  if (iVar3 == -1) {
    Abc_Print(-1,"Gia_ManNodeIfToGia(): Computing local AIG has failed.\n");
  }
  else {
    for (uVar6 = 0; uVar6 < (byte)(pIfObj->CutBest).field_0x1f; uVar6 = uVar6 + 1) {
      pIVar4 = If_ManObj(pIfMan,*(int *)(&pIfObj[1].field_0x0 + uVar6 * 4));
      if (pIVar4 == (If_Obj_t *)0x0) break;
      (pIVar4->CutBest).Area = 0.0;
    }
    for (i = 0; i < pIfMan->vTemp->nSize; i = i + 1) {
      puVar5 = (undefined4 *)Vec_PtrEntry(pIfMan->vTemp,i);
      *puVar5 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManNodeIfToGia( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vLeaves, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    iRes = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pIfObj, pIfMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Gia_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return iRes;
}